

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O1

int Ivy_CutTruthPrint(Ivy_Man_t *p,Ivy_Cut_t *pCut,uint uTruth)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *vArray;
  void **ppvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = 0;
  iVar7 = 0;
  if (0 < (long)pCut->nSize) {
    lVar4 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(byte)pCut->pArray[lVar4];
      lVar4 = lVar4 + 1;
    } while (pCut->nSize != lVar4);
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vArray->pArray = ppvVar3;
  if (0 < pCut->nSize) {
    lVar4 = 0;
    iVar6 = 0;
    do {
      uVar1 = pCut->pArray[lVar4] >> 8;
      if (((int)uVar1 < 0) || (p->vObjs->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ivy_ObjCollectFanouts(p,(Ivy_Obj_t *)p->vObjs->pArray[uVar1],vArray);
      if (0 < (long)vArray->nSize) {
        lVar5 = 0;
        do {
          if (vArray->pArray[lVar5] == (void *)0x0) break;
          if ((*(uint *)((long)vArray->pArray[lVar5] + 8) & 0xf) == 4) {
            iVar6 = iVar6 + 1;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (vArray->nSize != lVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pCut->nSize);
  }
  iVar2 = 0;
  if (iVar6 < iVar7) {
    iVar2 = (iVar7 - iVar6) * 2;
  }
  return iVar2;
}

Assistant:

int Ivy_CutTruthPrint( Ivy_Man_t * p, Ivy_Cut_t * pCut, unsigned uTruth )
{
    Vec_Ptr_t * vArray;
    Ivy_Obj_t * pObj, * pFanout;
    int nLatches = 0;
    int nPresent = 0;
    int i, k;
    int fVerbose = 0;

    if ( fVerbose )
        printf( "Trying cut : {" );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        if ( fVerbose )
            printf( " %6d(%d)", Ivy_LeafId(pCut->pArray[i]), Ivy_LeafLat(pCut->pArray[i]) );
        nLatches += Ivy_LeafLat(pCut->pArray[i]);
    }
    if ( fVerbose )
        printf( " }   " );
    if ( fVerbose )
        printf( "Latches = %d. ", nLatches );

    // check if there are latches on the fanout edges
    vArray = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        pObj = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[i]) );
        Ivy_ObjForEachFanout( p, pObj, vArray, pFanout, k )
        {
            if ( Ivy_ObjIsLatch(pFanout) )
            {
                nPresent++;
                break;
            }
        }
    }
    Vec_PtrSize( vArray );
    if ( fVerbose )
    {
        printf( "Present = %d. ", nPresent );
        if ( nLatches > nPresent )
            printf( "Clauses = %d. ", 2*(nLatches - nPresent) );
        printf( "\n" );
    }
    return ( nLatches > nPresent ) ? 2*(nLatches - nPresent) : 0;
}